

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O2

StrWriter * __thiscall moira::StrWriter::operator<<(StrWriter *this,Ffmt ffmt)

{
  char *pcVar1;
  char cVar2;
  
  if ((this->style->syntax & ~MOIRA_MIT) != GNU) {
    pcVar1 = this->ptr;
    this->ptr = pcVar1 + 1;
    *pcVar1 = '.';
  }
  pcVar1 = this->ptr;
  this->ptr = pcVar1 + 1;
  cVar2 = '?';
  if ((uint)ffmt.raw < 7) {
    cVar2 = (char)(0x6264777078736c >> ((char)ffmt.raw * '\b' & 0x3fU));
  }
  *pcVar1 = cVar2;
  return this;
}

Assistant:

StrWriter&
StrWriter::operator<<(Ffmt ffmt)
{
    if (style.syntax != Syntax::GNU && style.syntax != Syntax::GNU_MIT) *ptr++ = '.';

    switch (ffmt.raw) {

        case 0: *ptr++ = 'l'; break;
        case 1: *ptr++ = 's'; break;
        case 2: *ptr++ = 'x'; break;
        case 3: *ptr++ = 'p'; break;
        case 4: *ptr++ = 'w'; break;
        case 5: *ptr++ = 'd'; break;
        case 6: *ptr++ = 'b'; break;

        default:
            *ptr++ = '?';
    }

    return *this;
}